

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

ArrayNewData * __thiscall
wasm::Builder::makeArrayNewData
          (Builder *this,HeapType type,Name seg,Expression *offset,Expression *size)

{
  Type local_48;
  ArrayNewData *local_40;
  ArrayNewData *ret;
  Expression *size_local;
  Expression *offset_local;
  Builder *this_local;
  Name seg_local;
  HeapType type_local;
  
  seg_local.super_IString.str._M_len = seg.super_IString.str._M_str;
  this_local = seg.super_IString.str._M_len;
  ret = (ArrayNewData *)size;
  size_local = offset;
  offset_local = (Expression *)this;
  seg_local.super_IString.str._M_str = (char *)type.id;
  local_40 = MixedArena::alloc<wasm::ArrayNewData>(&this->wasm->allocator);
  wasm::Name::operator=(&local_40->segment,(Name *)&this_local);
  local_40->offset = size_local;
  local_40->size = (Expression *)ret;
  wasm::Type::Type(&local_48,(HeapType)seg_local.super_IString.str._M_str,NonNullable,Inexact);
  (local_40->super_SpecificExpression<(wasm::Expression::Id)71>).super_Expression.type.id =
       local_48.id;
  ArrayNewData::finalize(local_40);
  return local_40;
}

Assistant:

ArrayNewData* makeArrayNewData(HeapType type,
                                 Name seg,
                                 Expression* offset,
                                 Expression* size) {
    auto* ret = wasm.allocator.alloc<ArrayNewData>();
    ret->segment = seg;
    ret->offset = offset;
    ret->size = size;
    ret->type = Type(type, NonNullable);
    ret->finalize();
    return ret;
  }